

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O2

void __thiscall soplex::SPxBasisBase<double>::removedRow(SPxBasisBase<double> *this,int i)

{
  Representation RVar1;
  SPxSolverBase<double> *pSVar2;
  Status *pSVar3;
  SPxId *pSVar4;
  SVectorBase<double> *pSVar5;
  uint uVar6;
  SPxId id;
  SPxRowId local_38;
  
  RVar1 = this->theLP->theRep;
  if (RVar1 == ROW) {
    if ((this->thedesc).rowstat.data[i] < ~P_FREE) {
      setStatus(this,NO_PROBLEM);
      this->factorized = false;
    }
  }
  else {
    this->factorized = false;
    if (RVar1 * (this->thedesc).rowstat.data[i] < 1) {
      setStatus(this,NO_PROBLEM);
    }
    else if ((NO_PROBLEM < this->thestatus) && (this->matrixIsSetup == true)) {
      for (uVar6 = (this->theLP->thecovectors->set).thenum; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
        id.super_DataKey = (this->theBaseId).data[uVar6].super_DataKey;
        if (id.super_DataKey.info < 0) {
          pSVar2 = this->theLP;
          SPxRowId::SPxRowId(&local_38,&id);
          if ((pSVar2->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              set.theitem[local_38.super_DataKey.idx].info < 0) {
            pSVar4 = (this->theBaseId).data;
            pSVar4[uVar6].super_DataKey =
                 pSVar4[(this->theLP->thecovectors->set).thenum].super_DataKey;
            if ((int)uVar6 < (this->theLP->thecovectors->set).thenum) {
              pSVar5 = SPxSolverBase<double>::vector(this->theLP,(this->theBaseId).data + uVar6);
              (this->matrix).data[uVar6] = pSVar5;
            }
            break;
          }
        }
      }
    }
  }
  pSVar3 = (this->thedesc).rowstat.data;
  pSVar3[i] = pSVar3[(this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thenum];
  reDim(this);
  return;
}

Assistant:

void SPxBasisBase<R>::removedRow(int i)
{

   assert(status() >  NO_PROBLEM);
   assert(theLP    != nullptr);

   if(theLP->rep() == SPxSolverBase<R>::ROW)
   {
      if(theLP->isBasic(thedesc.rowStatus(i)))
      {
         setStatus(NO_PROBLEM);
         factorized = false;

         SPxOut::debug(this, "DCHBAS05 Warning: deleting basic row!\n");
      }
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::COLUMN);
      factorized = false;

      if(!theLP->isBasic(thedesc.rowStatus(i)))
      {
         setStatus(NO_PROBLEM);
         SPxOut::debug(this, "DCHBAS06 Warning: deleting nonbasic row!\n");
      }
      else if(status() > NO_PROBLEM && matrixIsSetup)
      {
         for(int j = theLP->dim(); j >= 0; --j)
         {
            SPxId id = baseId(j);

            if(id.isSPxRowId() && !theLP->has(SPxRowId(id)))
            {
               baseId(j) = baseId(theLP->dim());

               if(j < theLP->dim())
                  matrix[j] = &theLP->vector(baseId(j));

               break;
            }
         }
      }
   }

   thedesc.rowStatus(i) = thedesc.rowStatus(theLP->nRows());
   reDim();
}